

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.cpp
# Opt level: O2

void __thiscall
slang::ast::BinaryAssertionExpr::requireSequence
          (BinaryAssertionExpr *this,ASTContext *context,DiagCode code)

{
  BinaryAssertionOperator BVar1;
  SyntaxNode *this_00;
  logic_error *this_01;
  SourceRange sourceRange;
  allocator<char> local_e1;
  string local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  BVar1 = this->op;
  if (NonOverlappedFollowedBy < BVar1) {
    this_01 = (logic_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/expressions/AssertionExpr.cpp"
               ,&local_e1);
    std::operator+(&local_a0,&local_c0,":");
    std::__cxx11::to_string(&local_e0,0x3af);
    std::operator+(&local_80,&local_a0,&local_e0);
    std::operator+(&local_60,&local_80,": ");
    std::operator+(&local_40,&local_60,"Default case should be unreachable!");
    std::logic_error::logic_error(this_01,(string *)&local_40);
    __cxa_throw(this_01,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  if ((0x7fe0U >> (BVar1 & 0x1f) & 1) != 0) {
    this_00 = (this->super_AssertionExpr).syntax;
    if (this_00 != (SyntaxNode *)0x0) {
      sourceRange = slang::syntax::SyntaxNode::sourceRange(this_00);
      ASTContext::addDiag(context,code,sourceRange);
      return;
    }
    assert::assertFailed
              ("syntax",
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/expressions/AssertionExpr.cpp"
               ,0x3ab,
               "void slang::ast::BinaryAssertionExpr::requireSequence(const ASTContext &, DiagCode) const"
              );
  }
  if ((0x1cU >> (BVar1 & 0x1f) & 1) != 0) {
    return;
  }
  AssertionExpr::requireSequence(this->left,context,code);
  AssertionExpr::requireSequence(this->right,context,code);
  return;
}

Assistant:

void BinaryAssertionExpr::requireSequence(const ASTContext& context, DiagCode code) const {
    switch (op) {
        case BinaryAssertionOperator::And:
        case BinaryAssertionOperator::Or:
            left.requireSequence(context, code);
            right.requireSequence(context, code);
            return;
        case BinaryAssertionOperator::Intersect:
        case BinaryAssertionOperator::Throughout:
        case BinaryAssertionOperator::Within:
            return;
        case BinaryAssertionOperator::Iff:
        case BinaryAssertionOperator::Until:
        case BinaryAssertionOperator::SUntil:
        case BinaryAssertionOperator::UntilWith:
        case BinaryAssertionOperator::SUntilWith:
        case BinaryAssertionOperator::Implies:
        case BinaryAssertionOperator::OverlappedImplication:
        case BinaryAssertionOperator::NonOverlappedImplication:
        case BinaryAssertionOperator::OverlappedFollowedBy:
        case BinaryAssertionOperator::NonOverlappedFollowedBy:
            ASSERT(syntax);
            context.addDiag(code, syntax->sourceRange());
            return;
    }
    ASSUME_UNREACHABLE;
}